

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O3

bool __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::MapToNeighSide<double>
          (TPZGeoBlend<pzgeom::TPZGeoPoint> *this,int side,int SideDim,TPZVec<double> *InternalPar,
          TPZVec<double> *NeighPar,TPZFMatrix<double> *JacNeighSide)

{
  bool bVar1;
  TPZManVector<double,_3> SidePar;
  TPZFNMatrix<9,_double> JacSide;
  TPZTransform<double> tr;
  int local_2f4;
  TPZVec<double> *local_2f0;
  TPZManVector<double,_3> local_2e8;
  TPZFMatrix<double> local_2b0;
  double local_220 [10];
  TPZTransform<double> local_1d0;
  
  local_2b0.fElem = local_220;
  local_2b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_2b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_2b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_2b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_2b0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_2b0.fSize = 9;
  local_2f4 = side;
  local_2f0 = NeighPar;
  local_2b0.fGiven = local_2b0.fElem;
  TPZVec<int>::TPZVec(&local_2b0.fPivot.super_TPZVec<int>,0);
  local_2b0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_2b0.fPivot.super_TPZVec<int>.fStore = local_2b0.fPivot.fExtAlloc;
  local_2b0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_2b0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_2b0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_2b0.fWork.fStore = (double *)0x0;
  local_2b0.fWork.fNElements = 0;
  local_2b0.fWork.fNAlloc = 0;
  local_2b0.fElem = (double *)0x0;
  local_2b0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  TPZManVector<double,_3>::TPZManVector(&local_2e8,(long)SideDim);
  bVar1 = pztopology::TPZPoint::CheckProjectionForSingularity<double>(&local_2f4,InternalPar);
  pztopology::TPZPoint::MapToSide<double>
            (local_2f4,InternalPar,&local_2e8.super_TPZVec<double>,&local_2b0);
  if (bVar1) {
    (*local_2f0->_vptr_TPZVec[3])(local_2f0,(long)SideDim);
    TPZTransform<double>::TPZTransform(&local_1d0);
    TPZTransform<double>::CopyFrom
              (&local_1d0,(TPZTransform<double> *)((long)this + (long)local_2f4 * 0x1a0 + -0x170));
    TPZTransform<double>::Apply(&local_1d0,&local_2e8.super_TPZVec<double>,local_2f0);
    (*(JacNeighSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacNeighSide,0,0);
    TPZTransform<double>::CopyFrom
              (&local_1d0,(TPZTransform<double> *)((long)this + (long)local_2f4 * 0x1a0 + -0x170));
    (*(JacNeighSide->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(JacNeighSide,
             local_1d0.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
             fRow,local_2b0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol);
    (*local_1d0.fMult.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable[0x25])(&local_1d0.fMult,&local_2b0,JacNeighSide,0);
    TPZTransform<double>::~TPZTransform(&local_1d0);
  }
  TPZManVector<double,_3>::~TPZManVector(&local_2e8);
  TPZFMatrix<double>::~TPZFMatrix(&local_2b0,&PTR_PTR_01816200);
  return bVar1;
}

Assistant:

inline bool
    pzgeom::TPZGeoBlend<TGeo>::MapToNeighSide(int side, int SideDim, TPZVec<T> &InternalPar, TPZVec<T> &NeighPar,
                                              TPZFMatrix<T> &JacNeighSide) const {
        TPZFNMatrix<9, T> JacSide;

        TPZManVector<T, 3> SidePar(SideDim);
        const bool check = TGeo::CheckProjectionForSingularity(side, InternalPar);

        this->MapToSide(side, InternalPar, SidePar, JacSide);
        if (!check) {
            #ifdef PZ_LOG2
            td::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";
            sout << "\tmapping is not regular"<<std::endl;
            LOGPZ_DEBUG(logger,sout.str())
            #endif
            return false;
        }
#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "side " << side << std::endl;
            sout << "InternalPar: ";
            for(int i = 0; i < InternalPar.NElements(); i++) sout << InternalPar[i] << "\t";
            sout << "\n";

            sout << "SidePar: ";
            for(int i = 0; i < SidePar.NElements(); i++) sout << SidePar[i] << "\t";
            sout << "\n";

            JacSide.Print("JacSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        NeighPar.Resize(SideDim);
        TPZTransform<T> tr;
        TransfBetweenNeigh(side, tr);
        tr.Apply(SidePar, NeighPar);

        JacNeighSide.Resize(0, 0);
        TransfBetweenNeigh(side, tr);
        JacNeighSide.Resize(tr.Mult().Rows(), JacSide.Cols());
        tr.Mult().Multiply(JacSide, JacNeighSide);

#ifdef PZ_LOG2
        if(logger.isDebugEnabled())
        {
            std::stringstream sout;
            
            sout << "NeighPar: ";
            for(int i = 0; i < NeighPar.NElements(); i++) sout << NeighPar[i] << "\t";
            sout << "\n";
            
            JacNeighSide.Print("JacNeighSide = ",sout);
            LOGPZ_DEBUG(logger,sout.str())
        }
#endif

        return true;
    }